

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_byte(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_798;
  StrX local_788;
  char *local_778;
  char *actRetCanRep_inchar_5;
  wchar16 *local_760;
  XMLCh *actRetCanRep_9;
  undefined1 local_750 [4];
  Status myStatus_23;
  StrX local_740;
  char *local_730;
  char *actRetCanRep_inchar_4;
  wchar16 *local_718;
  XMLCh *actRetCanRep_8;
  undefined1 local_708 [4];
  Status myStatus_22;
  StrX local_6f8;
  StrX local_6e8;
  long local_6d8;
  XMLCh *actRetCanRep_7;
  undefined1 local_6c8 [4];
  Status myStatus_21;
  StrX local_6b8;
  StrX local_6a8;
  long local_698;
  XMLCh *actRetCanRep_6;
  undefined1 local_688 [4];
  Status myStatus_20;
  StrX local_678;
  StrX local_668;
  long local_658;
  XMLCh *actRetCanRep_5;
  undefined1 local_648 [4];
  Status myStatus_19;
  StrX local_638;
  StrX local_628;
  long local_618;
  XMLCh *actRetCanRep_4;
  undefined1 local_608 [4];
  Status myStatus_18;
  StrX local_5f8;
  char *local_5e8;
  char *actRetCanRep_inchar_3;
  wchar16 *local_5d0;
  XMLCh *actRetCanRep_3;
  undefined1 local_5c0 [4];
  Status myStatus_17;
  StrX local_5b0;
  char *local_5a0;
  char *actRetCanRep_inchar_2;
  wchar16 *local_588;
  XMLCh *actRetCanRep_2;
  undefined1 local_578 [4];
  Status myStatus_16;
  StrX local_568;
  char *local_558;
  char *actRetCanRep_inchar_1;
  wchar16 *local_540;
  XMLCh *actRetCanRep_1;
  undefined1 local_530 [4];
  Status myStatus_15;
  StrX local_520;
  char *local_510;
  char *actRetCanRep_inchar;
  wchar16 *local_4f8;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_4d8;
  StrX local_4c8;
  XSValue *local_4b8;
  XSValue *actRetValue_6;
  undefined1 local_4a8 [4];
  Status myStatus_13;
  StrX local_498;
  StrX local_488;
  XSValue *local_478;
  XSValue *actRetValue_5;
  undefined1 local_468 [4];
  Status myStatus_12;
  StrX local_458;
  StrX local_448;
  XSValue *local_438;
  XSValue *actRetValue_4;
  undefined1 local_428 [4];
  Status myStatus_11;
  StrX local_418;
  StrX local_408;
  XSValue *local_3f8;
  XSValue *actRetValue_3;
  undefined1 local_3e8 [4];
  Status myStatus_10;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  StrX local_388;
  XSValue *local_378;
  XSValue *actRetValue_2;
  undefined1 local_368 [4];
  Status myStatus_9;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  StrX local_308;
  XSValue *local_2f8;
  XSValue *actRetValue_1;
  undefined1 local_2e8 [4];
  Status myStatus_8;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  StrX local_288;
  XSValue *local_278;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_258;
  StrX local_248;
  byte local_235;
  Status local_234;
  undefined1 local_230 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_220;
  StrX local_210;
  byte local_1fd;
  Status local_1fc;
  undefined1 local_1f8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_1e8;
  StrX local_1d8;
  byte local_1c5;
  Status local_1c4;
  undefined1 local_1c0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1b0;
  StrX local_1a0;
  byte local_18d;
  Status local_18c;
  undefined1 local_188 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_178;
  byte local_165;
  Status local_164;
  undefined1 local_160 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_150;
  byte local_13d;
  Status local_13c;
  undefined1 local_138 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_118;
  byte local_105;
  Status local_104;
  char acStack_100 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [4];
  char data_rawstr_2 [7];
  char data_canrep_1 [4];
  char data_rawstr_1 [12];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char lex_v_ran_v_2_canrep [5];
  char lex_v_ran_v_1_canrep [4];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_iv_2 [5];
  char lex_v_ran_iv_1 [5];
  char lex_v_ran_v_2 [5];
  char lex_v_ran_v_1 [5];
  char lex_v_ran_v_0 [10];
  bool toValidate;
  DataType dt;
  
  _lex_v_ran_v_1 = 0x2020203231202020;
  builtin_strncpy(lex_v_ran_v_2,"+127",5);
  builtin_strncpy(lex_v_ran_iv_1,"-128",5);
  builtin_strncpy(lex_v_ran_iv_2,"+128",5);
  act_v_ran_v_0.fValue._28_1_ = 0;
  act_v_ran_v_0.fValue._24_4_ = 0x3932312d;
  act_v_ran_v_0.f_datatype._0_1_ = dt_gDay;
  act_v_ran_v_1.f_datatype._0_1_ = 0x7f;
  act_v_ran_v_2.f_datatype._0_1_ = 0x80;
  builtin_strncpy(lex_v_ran_v_2_canrep,"127",4);
  stack0xffffffffffffff44 = 0x3832312d;
  lex_v_ran_iv_2_canrep[0] = '1';
  lex_v_ran_iv_2_canrep[1] = '2';
  lex_v_ran_iv_2_canrep[2] = '8';
  lex_v_ran_iv_2_canrep[3] = '\0';
  stack0xffffffffffffff38 = 0x3932312d;
  builtin_strncpy(lex_iv_2,"1234.456",8);
  lex_iv_1[0] = '\0';
  stack0xffffffffffffff20 = 0x36356234333231;
  stack0xffffffffffffff10 = 0x203332312b202020;
  data_rawstr_1[0] = ' ';
  data_rawstr_1[1] = ' ';
  data_rawstr_1[2] = '\n';
  data_rawstr_1[3] = '\0';
  data_rawstr_2[0] = '1';
  data_rawstr_2[1] = '2';
  data_rawstr_2[2] = '3';
  data_rawstr_2[3] = '\0';
  data_canrep_2[0] = '2';
  data_canrep_2[1] = '3';
  data_canrep_2[2] = '\0';
  myStatus = 0x31303030;
  _acStack_100 = 0x333231;
  local_104 = st_Init;
  StrX::StrX(&local_118,lex_v_ran_v_1);
  pXVar3 = StrX::unicodeForm(&local_118);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_104,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_118);
  local_105 = bVar1 & 1;
  if (local_105 != 1) {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX((StrX *)local_138,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_138);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bc,lex_v_ran_v_1,pcVar4,1);
    StrX::~StrX((StrX *)local_138);
    errSeen = true;
  }
  local_13c = st_Init;
  StrX::StrX(&local_150,lex_v_ran_v_2);
  pXVar3 = StrX::unicodeForm(&local_150);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_13c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_150);
  local_13d = bVar1 & 1;
  if (local_13d != 1) {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX((StrX *)local_160,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_160);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8bd,lex_v_ran_v_2,pcVar4,1);
    StrX::~StrX((StrX *)local_160);
    errSeen = true;
  }
  local_164 = st_Init;
  StrX::StrX(&local_178,lex_v_ran_iv_1);
  pXVar3 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_164,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 != 1) {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX((StrX *)local_188,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_188);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8be,lex_v_ran_iv_1,pcVar4,1);
    StrX::~StrX((StrX *)local_188);
    errSeen = true;
  }
  local_18c = st_Init;
  StrX::StrX(&local_1a0,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm(&local_1a0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_18c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_1a0);
  local_18d = bVar1 & 1;
  if (local_18d == 0) {
    if (local_18c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_1c0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1c0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_18c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c1,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1c0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_1b0,pXVar3);
    pcVar4 = StrX::localForm(&local_1b0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c1,lex_v_ran_iv_2,pcVar4,0);
    StrX::~StrX(&local_1b0);
    errSeen = true;
  }
  local_1c4 = st_Init;
  StrX::StrX(&local_1d8,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_1d8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_1c4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_1d8);
  local_1c5 = bVar1 & 1;
  if (local_1c5 == 0) {
    if (local_1c4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_1f8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1f8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1c4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c2,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1f8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_1e8,pXVar3);
    pcVar4 = StrX::localForm(&local_1e8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c2,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_1e8);
    errSeen = true;
  }
  local_1fc = st_Init;
  StrX::StrX(&local_210,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_210);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_1fc,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_210);
  local_1fd = bVar1 & 1;
  if (local_1fd == 0) {
    if (local_1fc != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_230,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_230);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1fc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c5,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_230);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_220,pXVar3);
    pcVar4 = StrX::localForm(&local_220);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c5,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_220);
    errSeen = true;
  }
  local_234 = st_Init;
  StrX::StrX(&local_248,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_248);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_byte,&local_234,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_248);
  local_235 = bVar1 & 1;
  if (local_235 == 0) {
    if (local_234 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_234);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x8c6,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_258,pXVar3);
    pcVar4 = StrX::localForm(&local_258);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x8c6,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_258);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_288,lex_v_ran_v_1);
    pXVar3 = StrX::unicodeForm(&local_288);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_288);
    local_278 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_2e8,pXVar3);
      StrX::localForm((StrX *)local_2e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e3,lex_v_ran_v_1);
      StrX::~StrX((StrX *)local_2e8);
      errSeen = true;
    }
    else {
      memcpy(&local_2b0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_2d8,pvVar10,0x28);
      actValue.fValue.f_long = uStack_2a8;
      actValue._0_8_ = local_2b0;
      actValue.fValue._8_8_ = local_2a0;
      actValue.fValue._16_8_ = uStack_298;
      actValue.fValue.f_datetime.f_milisec = (double)local_290;
      expValue.fValue.f_long = uStack_2d0;
      expValue._0_8_ = local_2d8;
      expValue.fValue._8_8_ = local_2c8;
      expValue.fValue._16_8_ = uStack_2c0;
      expValue.fValue.f_datetime.f_milisec = (double)local_2b8;
      bVar2 = compareActualValue(dt_byte,actValue,expValue);
      pXVar5 = local_278;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_278 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_278);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_308,lex_v_ran_v_2);
    pXVar3 = StrX::unicodeForm(&local_308);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_308);
    local_2f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_368,pXVar3);
      StrX::localForm((StrX *)local_368);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e5,lex_v_ran_v_2);
      StrX::~StrX((StrX *)local_368);
      errSeen = true;
    }
    else {
      memcpy(&local_330,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_358,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_328;
      actValue_00._0_8_ = local_330;
      actValue_00.fValue._8_8_ = local_320;
      actValue_00.fValue._16_8_ = uStack_318;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_310;
      expValue_00.fValue.f_long = uStack_350;
      expValue_00._0_8_ = local_358;
      expValue_00.fValue._8_8_ = local_348;
      expValue_00.fValue._16_8_ = uStack_340;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_338;
      bVar2 = compareActualValue(dt_byte,actValue_00,expValue_00);
      pXVar5 = local_2f8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_2f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_388,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm(&local_388);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_388);
    local_378 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_3e8,pXVar3);
      StrX::localForm((StrX *)local_3e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e6,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_3e8);
      errSeen = true;
    }
    else {
      memcpy(&local_3b0,pXVar5,0x28);
      pcVar4 = lex_v_ran_v_2_canrep + 4;
      memcpy(&local_3d8,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_3a8;
      actValue_01._0_8_ = local_3b0;
      actValue_01.fValue._8_8_ = local_3a0;
      actValue_01.fValue._16_8_ = uStack_398;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_390;
      expValue_01.fValue.f_long = uStack_3d0;
      expValue_01._0_8_ = local_3d8;
      expValue_01.fValue._8_8_ = local_3c8;
      expValue_01.fValue._16_8_ = uStack_3c0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_3b8;
      bVar2 = compareActualValue(dt_byte,actValue_01,expValue_01);
      pXVar5 = local_378;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_378 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_378);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_408,lex_v_ran_iv_2);
    pXVar3 = StrX::unicodeForm(&local_408);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_408);
    local_3f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)local_428,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_428);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e7,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_428);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_418,pXVar3);
      StrX::localForm(&local_418);
      pvVar10 = (void *)0x8e7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e7,lex_v_ran_iv_2);
      StrX::~StrX(&local_418);
      pXVar5 = local_3f8;
      errSeen = true;
      if (local_3f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_448,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_448);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_448);
    local_438 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)local_468,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_468);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8e8,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_468);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_458,pXVar3);
      StrX::localForm(&local_458);
      pvVar10 = (void *)0x8e8;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8e8,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX(&local_458);
      pXVar5 = local_438;
      errSeen = true;
      if (local_438 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_438);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_488,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_488);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_488);
    local_478 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)local_4a8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_4a8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8ea,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_4a8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_498,pXVar3);
      StrX::localForm(&local_498);
      pvVar10 = (void *)0x8ea;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8ea,lex_iv_2);
      StrX::~StrX(&local_498);
      pXVar5 = local_478;
      errSeen = true;
      if (local_478 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_478);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_4c8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_4c8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_byte,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4c8);
    local_4b8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x8eb,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_4d8,pXVar3);
      StrX::localForm(&local_4d8);
      pvVar10 = (void *)0x8eb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x8eb,data_rawstr_1 + 8);
      StrX::~StrX(&local_4d8);
      pXVar5 = local_4b8;
      errSeen = true;
      if (local_4b8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4b8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_rawstr_2 + 4);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_byte,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_4f8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_530,pXVar3);
      StrX::localForm((StrX *)local_530);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x909,data_rawstr_2 + 4);
      StrX::~StrX((StrX *)local_530);
      errSeen = true;
    }
    else {
      local_510 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_510,data_rawstr_2);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX(&local_520,pXVar3);
        pcVar4 = StrX::localForm(&local_520);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x909,data_rawstr_2 + 4,pcVar4,local_510,data_rawstr_2);
        StrX::~StrX(&local_520);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_4f8);
      xercesc_4_0::XMLString::release(&local_510,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,(char *)&myStatus);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_540 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_578,pXVar3);
      StrX::localForm((StrX *)local_578);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90a,&myStatus);
      StrX::~StrX((StrX *)local_578);
      errSeen = true;
    }
    else {
      local_558 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_558,acStack_100);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX(&local_568,pXVar3);
        pcVar4 = StrX::localForm(&local_568);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90a,&myStatus,pcVar4,local_558,acStack_100);
        StrX::~StrX(&local_568);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_540);
      xercesc_4_0::XMLString::release(&local_558,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_v_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_588 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_5c0,pXVar3);
      StrX::localForm((StrX *)local_5c0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90c,lex_v_ran_v_2);
      StrX::~StrX((StrX *)local_5c0);
      errSeen = true;
    }
    else {
      local_5a0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5a0,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX(&local_5b0,pXVar3);
        pcVar4 = StrX::localForm(&local_5b0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90c,lex_v_ran_v_2,pcVar4,local_5a0,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_5b0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_588);
      xercesc_4_0::XMLString::release(&local_5a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_5d0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_608,pXVar3);
      StrX::localForm((StrX *)local_608);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90d,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_608);
      errSeen = true;
    }
    else {
      local_5e8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5e8,lex_v_ran_iv_2_canrep + 4);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX(&local_5f8,pXVar3);
        pcVar4 = StrX::localForm(&local_5f8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x90d,lex_v_ran_iv_1,pcVar4,local_5e8,lex_v_ran_iv_2_canrep + 4);
        StrX::~StrX(&local_5f8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5d0);
      xercesc_4_0::XMLString::release(&local_5e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_628,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_628);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_628);
    local_618 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)local_648,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_648);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x90f,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_648);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_638,pXVar3);
      StrX::localForm(&local_638);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x90f,lex_iv_2);
      StrX::~StrX(&local_638);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_618);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_668,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_668);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_668);
    local_658 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_byte);
        StrX::StrX((StrX *)local_688,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_688);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x910,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_688);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_678,pXVar3);
      StrX::localForm(&local_678);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x910,data_rawstr_1 + 8);
      StrX::~StrX(&local_678);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_658);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_6a8,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm(&local_6a8);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6a8);
  local_698 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_6c8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6c8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x915,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6c8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_6b8,pXVar3);
    StrX::localForm(&local_6b8);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x915,lex_v_ran_iv_2);
    StrX::~StrX(&local_6b8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_698);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_6e8,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_6e8);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6e8);
  local_6d8 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX((StrX *)local_708,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_708);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x916,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_708);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_6f8,pXVar3);
    pcVar4 = StrX::localForm(&local_6f8);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x916,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_6f8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6d8);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_718 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX((StrX *)local_750,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_750);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x919,lex_v_ran_iv_2,pcVar4);
    StrX::~StrX((StrX *)local_750);
    errSeen = true;
  }
  else {
    local_730 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_730,lex_v_ran_iv_2_canrep);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_740,pXVar3);
      pcVar4 = StrX::localForm(&local_740);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x919,lex_v_ran_iv_2,pcVar4,local_730,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_740);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_718);
    xercesc_4_0::XMLString::release(&local_730,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_byte,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_760 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_byte);
    StrX::StrX(&local_798,pXVar3);
    pcVar4 = StrX::localForm(&local_798);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x91a,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_798);
    errSeen = true;
  }
  else {
    local_778 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_778,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_byte);
      StrX::StrX(&local_788,pXVar3);
      pcVar4 = StrX::localForm(&local_788);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x91a,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,local_778,lex_iv_1 + 8
            );
      StrX::~StrX(&local_788);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_760);
    xercesc_4_0::XMLString::release(&local_778,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_byte()
{
    const XSValue::DataType dt = XSValue::dt_byte;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="   12   \n";

    const char lex_v_ran_v_1[]="+127";
    const char lex_v_ran_v_2[]="-128";
    const char lex_v_ran_iv_1[]="+128";
    const char lex_v_ran_iv_2[]="-129";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_char = (char)12;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_char = (char)+127;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_char = (char)-128;

    const char lex_v_ran_v_1_canrep[]="127";
    const char lex_v_ran_v_2_canrep[]="-128";
    const char lex_v_ran_iv_1_canrep[]="128";
    const char lex_v_ran_iv_2_canrep[]="-129";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.19.2 Canonical representation
 *
 * The canonical representation for byte is defined by prohibiting certain options from the
 * Lexical representation (3.3.19.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +123   \n";
    const char data_canrep_1[]="123";
    const char data_rawstr_2[]="000123";
    const char data_canrep_2[]="123";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}